

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_adapt.c
# Opt level: O0

void arkPrintAdaptMem(ARKodeHAdaptMem hadapt_mem,FILE *outfile)

{
  FILE *in_RSI;
  undefined8 *in_RDI;
  
  if (in_RDI != (undefined8 *)0x0) {
    fprintf(in_RSI,"ark_hadapt: etamax = %.16g\n",*in_RDI);
    fprintf(in_RSI,"ark_hadapt: etamx1 = %.16g\n",in_RDI[1]);
    fprintf(in_RSI,"ark_hadapt: etamxf = %.16g\n",in_RDI[2]);
    fprintf(in_RSI,"ark_hadapt: etamin = %.16g\n",in_RDI[3]);
    fprintf(in_RSI,"ark_hadapt: small_nef = %i\n",(ulong)*(uint *)(in_RDI + 4));
    fprintf(in_RSI,"ark_hadapt: etacf = %.16g\n",in_RDI[5]);
    fprintf(in_RSI,"ark_hadapt: imethod = %i\n",(ulong)*(uint *)(in_RDI + 0xc));
    fprintf(in_RSI,"ark_hadapt: ehist =  %.16g  %.16g\n",in_RDI[8],in_RDI[9]);
    fprintf(in_RSI,"ark_hadapt: hhist =  %.16g  %.16g\n",in_RDI[10],in_RDI[0xb]);
    fprintf(in_RSI,"ark_hadapt: cfl = %.16g\n",in_RDI[0xd]);
    fprintf(in_RSI,"ark_hadapt: safety = %.16g\n",in_RDI[0xe]);
    fprintf(in_RSI,"ark_hadapt: bias = %.16g\n",in_RDI[0xf]);
    fprintf(in_RSI,"ark_hadapt: growth = %.16g\n",in_RDI[0x10]);
    fprintf(in_RSI,"ark_hadapt: lbound = %.16g\n",in_RDI[0x11]);
    fprintf(in_RSI,"ark_hadapt: ubound = %.16g\n",in_RDI[0x12]);
    fprintf(in_RSI,"ark_hadapt: k1 = %.16g\n",in_RDI[0x13]);
    fprintf(in_RSI,"ark_hadapt: k2 = %.16g\n",in_RDI[0x14]);
    fprintf(in_RSI,"ark_hadapt: k3 = %.16g\n",in_RDI[0x15]);
    fprintf(in_RSI,"ark_hadapt: q = %i\n",(ulong)*(uint *)(in_RDI + 0x16));
    fprintf(in_RSI,"ark_hadapt: p = %i\n",(ulong)*(uint *)((long)in_RDI + 0xb4));
    fprintf(in_RSI,"ark_hadapt: pq = %i\n",(ulong)*(uint *)(in_RDI + 0x17));
    fprintf(in_RSI,"ark_hadapt: nst_acc = %li\n",in_RDI[0x1a]);
    fprintf(in_RSI,"ark_hadapt: nst_exp = %li\n",in_RDI[0x1b]);
    if ((code *)in_RDI[0x18] == arkExpStab) {
      fprintf(in_RSI,"  ark_hadapt: Default explicit stability function\n");
    }
    else {
      fprintf(in_RSI,"  ark_hadapt: User provided explicit stability function\n");
      fprintf(in_RSI,"  ark_hadapt: stability function data pointer = %p\n",in_RDI[0x19]);
    }
  }
  return;
}

Assistant:

void arkPrintAdaptMem(ARKodeHAdaptMem hadapt_mem, FILE *outfile)
{
  if (hadapt_mem != NULL) {
    fprintf(outfile, "ark_hadapt: etamax = %"RSYM"\n", hadapt_mem->etamax);
    fprintf(outfile, "ark_hadapt: etamx1 = %"RSYM"\n", hadapt_mem->etamx1);
    fprintf(outfile, "ark_hadapt: etamxf = %"RSYM"\n", hadapt_mem->etamxf);
    fprintf(outfile, "ark_hadapt: etamin = %"RSYM"\n", hadapt_mem->etamin);
    fprintf(outfile, "ark_hadapt: small_nef = %i\n", hadapt_mem->small_nef);
    fprintf(outfile, "ark_hadapt: etacf = %"RSYM"\n", hadapt_mem->etacf);
    fprintf(outfile, "ark_hadapt: imethod = %i\n", hadapt_mem->imethod);
    fprintf(outfile, "ark_hadapt: ehist =  %"RSYM"  %"RSYM"\n",
            hadapt_mem->ehist[0],
            hadapt_mem->ehist[1]);
    fprintf(outfile, "ark_hadapt: hhist =  %"RSYM"  %"RSYM"\n",
            hadapt_mem->hhist[0],
            hadapt_mem->hhist[1]);
    fprintf(outfile, "ark_hadapt: cfl = %"RSYM"\n", hadapt_mem->cfl);
    fprintf(outfile, "ark_hadapt: safety = %"RSYM"\n", hadapt_mem->safety);
    fprintf(outfile, "ark_hadapt: bias = %"RSYM"\n", hadapt_mem->bias);
    fprintf(outfile, "ark_hadapt: growth = %"RSYM"\n", hadapt_mem->growth);
    fprintf(outfile, "ark_hadapt: lbound = %"RSYM"\n", hadapt_mem->lbound);
    fprintf(outfile, "ark_hadapt: ubound = %"RSYM"\n", hadapt_mem->ubound);
    fprintf(outfile, "ark_hadapt: k1 = %"RSYM"\n", hadapt_mem->k1);
    fprintf(outfile, "ark_hadapt: k2 = %"RSYM"\n", hadapt_mem->k2);
    fprintf(outfile, "ark_hadapt: k3 = %"RSYM"\n", hadapt_mem->k3);
    fprintf(outfile, "ark_hadapt: q = %i\n", hadapt_mem->q);
    fprintf(outfile, "ark_hadapt: p = %i\n", hadapt_mem->p);
    fprintf(outfile, "ark_hadapt: pq = %i\n", hadapt_mem->pq);
    fprintf(outfile, "ark_hadapt: nst_acc = %li\n", hadapt_mem->nst_acc);
    fprintf(outfile, "ark_hadapt: nst_exp = %li\n", hadapt_mem->nst_exp);
    if (hadapt_mem->expstab == arkExpStab) {
      fprintf(outfile, "  ark_hadapt: Default explicit stability function\n");
    } else {
      fprintf(outfile, "  ark_hadapt: User provided explicit stability function\n");
      fprintf(outfile, "  ark_hadapt: stability function data pointer = %p\n",
              hadapt_mem->estab_data);
    }
  }
}